

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_0::verifySingleColored
               (TestLog *log,ConstPixelBufferAccess *result,Vec4 *refColor)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  float *pfVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  Surface *pSVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int px;
  int y;
  int iVar11;
  int z;
  Surface errorMask;
  Surface ideal;
  PixelBufferAccess idealAccess;
  string local_228;
  string local_208;
  Surface local_1e8;
  string local_1d0;
  string local_1b0;
  Surface local_190;
  undefined1 local_178 [8];
  float afStack_170 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [6];
  LogImage local_e8;
  PixelBufferAccess local_58;
  
  iVar11 = (result->m_size).m_data[0];
  tcu::Surface::Surface(&local_190,iVar11,iVar11);
  local_178._0_4_ = RGBA;
  local_178._4_4_ = UNORM_INT8;
  if ((void *)local_190.m_pixels.m_cap != (void *)0x0) {
    local_190.m_pixels.m_cap = (size_t)local_190.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,(TextureFormat *)local_178,local_190.m_width,local_190.m_height,1,
             (void *)local_190.m_pixels.m_cap);
  tcu::Surface::Surface(&local_1e8,iVar11,iVar11);
  local_e8.m_name._M_dataplus._M_p = (char *)0x300000008;
  if ((void *)local_1e8.m_pixels.m_cap != (void *)0x0) {
    local_1e8.m_pixels.m_cap = (size_t)local_1e8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_178,(TextureFormat *)&local_e8,local_1e8.m_width,
             local_1e8.m_height,1,(void *)local_1e8.m_pixels.m_cap);
  local_228._M_dataplus._M_p._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_228);
  tcu::clear((PixelBufferAccess *)local_178,(Vec4 *)&local_e8);
  tcu::clear(&local_58,refColor);
  bVar8 = true;
  if (0 < iVar11) {
    z = 0;
    do {
      y = 0;
      do {
        tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_178,(int)result,y,z);
        if (((float)local_178._0_4_ != refColor->m_data[0]) ||
           (NAN((float)local_178._0_4_) || NAN(refColor->m_data[0]))) {
LAB_0162e13a:
          *(undefined4 *)((long)local_1e8.m_pixels.m_ptr + (long)(local_1e8.m_width * z + y) * 4) =
               0xff0000ff;
          bVar8 = false;
        }
        else {
          uVar9 = 0xffffffffffffffff;
          do {
            if (uVar9 == 2) goto LAB_0162e15a;
            pfVar6 = afStack_170 + uVar9;
            uVar1 = uVar9 + 1;
            lVar7 = uVar9 + 2;
          } while ((*pfVar6 == refColor->m_data[lVar7]) &&
                  (uVar9 = uVar1, !NAN(*pfVar6) && !NAN(refColor->m_data[lVar7])));
          if (uVar1 < 3) goto LAB_0162e13a;
        }
LAB_0162e15a:
        y = y + 1;
      } while (y != iVar11);
      z = z + 1;
    } while (z != iVar11);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"VerifyResult","");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_e8,&local_228,&local_208);
  tcu::TestLog::startImageSet
            (log,local_e8.m_name._M_dataplus._M_p,local_e8.m_description._M_dataplus._M_p);
  paVar3 = &local_1b0.field_2;
  local_1b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Rendered","");
  paVar2 = &local_1d0.field_2;
  local_1d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Rendered image","");
  tcu::LogImage::LogImage
            ((LogImage *)local_178,&local_1b0,&local_1d0,result,QP_IMAGE_COMPRESSION_MODE_BEST);
  iVar11 = (int)log;
  tcu::LogImage::write((LogImage *)local_178,iVar11,__buf,(size_t)result);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p != local_148) {
    operator_delete(local_158._M_p,local_148[0]._M_allocated_capacity + 1);
  }
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_e8.m_description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_description._M_dataplus._M_p != paVar4) {
    operator_delete(local_e8.m_description._M_dataplus._M_p,
                    local_e8.m_description.field_2._M_allocated_capacity + 1);
  }
  paVar5 = &local_e8.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_name._M_dataplus._M_p != paVar5) {
    operator_delete(local_e8.m_name._M_dataplus._M_p,
                    local_e8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (!bVar8) {
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Reference","");
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Ideal reference image","")
    ;
    pSVar10 = &local_190;
    tcu::LogImage::LogImage
              ((LogImage *)local_178,&local_228,&local_208,pSVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_178,iVar11,__buf_00,(size_t)pSVar10);
    local_1b0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"ErrorMask","");
    local_1d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Error mask","");
    pSVar10 = &local_1e8;
    tcu::LogImage::LogImage(&local_e8,&local_1b0,&local_1d0,pSVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_e8,iVar11,__buf_01,(size_t)pSVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.m_description._M_dataplus._M_p != paVar4) {
      operator_delete(local_e8.m_description._M_dataplus._M_p,
                      local_e8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.m_name._M_dataplus._M_p != paVar5) {
      operator_delete(local_e8.m_name._M_dataplus._M_p,
                      local_e8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_p != local_148) {
      operator_delete(local_158._M_p,local_148[0]._M_allocated_capacity + 1);
    }
    if (local_178 != (undefined1  [8])&local_168) {
      operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endImageSet(log);
  tcu::Surface::~Surface(&local_1e8);
  tcu::Surface::~Surface(&local_190);
  return bVar8;
}

Assistant:

static bool verifySingleColored (TestLog& log, const ConstPixelBufferAccess& result, const Vec4& refColor)
{
	const int					width			= result.getWidth();
	const int					height			= result.getWidth();
	tcu::Surface				ideal			(width, height);
	const PixelBufferAccess		idealAccess		= ideal.getAccess();
	tcu::Surface				errorMask		(width, height);
	bool						success			= true;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());
	tcu::clear(idealAccess, refColor);

	for (int py = 0; py < height; py++)
	for (int px = 0; px < width; px++)
	{
		if (result.getPixel(px, py) != refColor)
		{
			errorMask.setPixel(px, py, tcu::RGBA::red());
			success = false;
		}
	}

	log << TestLog::ImageSet("VerifyResult", "Verification result")
		<< TestLog::Image("Rendered", "Rendered image", result);

	if (!success)
	{
		log << TestLog::Image("Reference", "Ideal reference image", ideal)
			<< TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << TestLog::EndImageSet;

	return success;
}